

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmMove4<(moira::Instr)71,(moira::Mode)5,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  ushort in_CX;
  u32 *in_RDX;
  StrWriter *in_RSI;
  Moira *in_RDI;
  Ea<(moira::Mode)4,_(moira::Size)2> dst;
  Ea<(moira::Mode)5,_(moira::Size)2> src;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined6 in_stack_ffffffffffffffb8;
  u16 in_stack_ffffffffffffffbe;
  Moira *in_stack_ffffffffffffffc0;
  Ea<(moira::Mode)5,_(moira::Size)2> *in_stack_ffffffffffffffc8;
  StrWriter *in_stack_ffffffffffffffd0;
  
  Op<(moira::Mode)5,(moira::Size)2>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbe,
             (u32 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  Op<(moira::Mode)4,(moira::Size)2>
            ((Ea<(moira::Mode)4,_(moira::Size)2> *)&stack0xffffffffffffffbc,in_RDI,
             (ushort)((int)(uint)in_CX >> 9) & 7,in_RDX);
  pSVar1 = StrWriter::operator<<(in_RSI);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Align)(in_RDI->tab).raw);
  pSVar1 = StrWriter::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  StrWriter::operator<<(pSVar1,", ");
  StrWriter::operator<<
            ((StrWriter *)in_stack_ffffffffffffffc0,
             (Ea<(moira::Mode)4,_(moira::Size)2> *)
             CONCAT26(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8));
  return;
}

Assistant:

void
Moira::dasmMove4(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S>       ( _____________xxx(op), addr );
    auto dst = Op <MODE_PD,S> ( ____xxx_________(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}